

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.c
# Opt level: O2

_Bool container_iterator_lower_bound
                (container_t *c,uint8_t typecode,roaring_container_iterator_t *it,
                uint16_t *value_out,uint16_t val)

{
  ushort uVar1;
  uint8_t uVar2;
  ushort uVar3;
  int iVar4;
  uint uVar5;
  long lVar6;
  undefined7 in_register_00000031;
  bitset_container_t *container;
  array_container_t *ac;
  
  container = (bitset_container_t *)c;
  uVar2 = typecode;
  if ((int)CONCAT71(in_register_00000031,typecode) == 4) {
    uVar2 = *(uint8_t *)((long)c + 8);
    container = *c;
  }
  if (uVar2 == '\x03') {
    lVar6 = (long)container->cardinality;
    if (lVar6 != 0) {
      uVar3 = *(short *)((long)container->words + lVar6 * 4 + -2) +
              *(short *)((long)container->words + lVar6 * 4 + -4);
      goto LAB_00114fc8;
    }
  }
  else {
    if (uVar2 != '\x02') {
      uVar3 = bitset_container_maximum(container);
      goto LAB_00114fc8;
    }
    if ((long)container->cardinality != 0) {
      uVar3 = *(ushort *)((long)container->words + (long)container->cardinality * 2 + -2);
      goto LAB_00114fc8;
    }
  }
  uVar3 = 0;
LAB_00114fc8:
  if (val <= uVar3) {
    if (typecode == '\x03') {
      iVar4 = run_container_index_equalorlarger((run_container_t *)c,val);
      it->index = iVar4;
      uVar1 = *(ushort *)(*(long *)((long)c + 8) + (long)iVar4 * 4);
      uVar5 = (uint)uVar1;
      if (uVar1 <= val) {
        uVar5 = (uint)val;
      }
    }
    else if (typecode == '\x02') {
      iVar4 = array_container_index_equalorlarger((array_container_t *)c,val);
      it->index = iVar4;
      uVar5 = (uint)*(ushort *)(*(long *)((long)c + 8) + (long)iVar4 * 2);
    }
    else {
      uVar5 = bitset_container_index_equalorlarger((bitset_container_t *)c,val);
      it->index = uVar5;
    }
    *value_out = (uint16_t)uVar5;
  }
  return val <= uVar3;
}

Assistant:

bool container_iterator_lower_bound(const container_t *c, uint8_t typecode,
                                    roaring_container_iterator_t *it,
                                    uint16_t *value_out, uint16_t val) {
    if (val > container_maximum(c, typecode)) {
        return false;
    }
    switch (typecode) {
        case BITSET_CONTAINER_TYPE: {
            const bitset_container_t *bc = const_CAST_bitset(c);
            it->index = bitset_container_index_equalorlarger(bc, val);
            *value_out = it->index;
            return true;
        }
        case ARRAY_CONTAINER_TYPE: {
            const array_container_t *ac = const_CAST_array(c);
            it->index = array_container_index_equalorlarger(ac, val);
            *value_out = ac->array[it->index];
            return true;
        }
        case RUN_CONTAINER_TYPE: {
            const run_container_t *rc = const_CAST_run(c);
            it->index = run_container_index_equalorlarger(rc, val);
            if (rc->runs[it->index].value <= val) {
                *value_out = val;
            } else {
                *value_out = rc->runs[it->index].value;
            }
            return true;
        }
        default:
            assert(false);
            roaring_unreachable;
            return false;
    }
}